

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O1

uint64_t Data::Sprite::create_id
                   (uint64_t resource,uint64_t index,uint64_t mask_resource,uint64_t mask_index,
                   Color *color)

{
  return (ulong)color->blue |
         (ulong)color->green << 8 |
         (ulong)color->red << 0x10 |
         (mask_resource & 0xff) << 0x24 |
         ((ulong)((uint)index & 0xfff) << 0x2c) + (resource << 0x38) |
         (ulong)((uint)mask_index & 0xfff) << 0x18;
}

Assistant:

uint64_t
Data::Sprite::create_id(uint64_t resource, uint64_t index,
                        uint64_t mask_resource, uint64_t mask_index,
                        const Sprite::Color &color) {
  // 0xFF00000000000000
  uint64_t result = static_cast<uint64_t>(resource & 0xFF) << 56;
  // 0x00FFF00000000000
  result |= static_cast<uint64_t>(index & 0xFFF) << 44;
  // 0x00000FF000000000
  result |= static_cast<uint64_t>(mask_resource & 0xFF) << 36;
  // 0x0000000FFF000000
  result |= static_cast<uint64_t>(mask_index & 0xFFF) << 24;
  // 0x0000000000FF0000
  result |= static_cast<uint64_t>(color.red & 0xFF) << 16;
  // 0x000000000000FF00
  result |= static_cast<uint64_t>(color.green & 0xFF) << 8;
  // 0x00000000000000FF
  result |= static_cast<uint64_t>(color.blue & 0xFF) << 0;
  return result;
}